

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::NegativeTest4::deinit(NegativeTest4 *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_so_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))();
    this->m_so_id = 0;
  }
  return;
}

Assistant:

void NegativeTest4::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_so_id != 0)
	{
		gl.deleteShader(m_so_id);

		m_so_id = 0;
	}
}